

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPoint>::CreateBCGeoBlendEl
          (TPZGeoElRefLess<pzgeom::TPZGeoPoint> *this,int side,int bc)

{
  TPZGeoMesh *pTVar1;
  MElementType MVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  TPZGeoElSide me;
  int64_t index;
  TPZManVector<long,_10> nodeindices;
  TPZGeoElSide newelside;
  TPZGeoEl *pTVar5;
  
  TPZManVector<long,_10>::TPZManVector(&nodeindices,1);
  lVar4 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))(this,side,0);
  *nodeindices.super_TPZVec<long>.fStore = lVar4;
  pTVar1 = (this->super_TPZGeoEl).fMesh;
  MVar2 = pztopology::TPZPoint::Type(side);
  iVar3 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xd])
                    (pTVar1,(ulong)MVar2,&nodeindices,(ulong)(uint)bc,&index);
  pTVar5 = (TPZGeoEl *)CONCAT44(extraout_var,iVar3);
  me.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  me.fGeoEl = &this->super_TPZGeoEl;
  me.fSide = side;
  iVar3 = (**(code **)(*(long *)pTVar5 + 0xf0))(pTVar5);
  newelside.fSide = iVar3 + -1;
  newelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  newelside.fGeoEl = pTVar5;
  TPZGeoElSide::InsertConnectivity(&newelside,&me);
  (**(code **)(*(long *)pTVar5 + 0x78))(pTVar5);
  TPZManVector<long,_10>::~TPZManVector(&nodeindices);
  return pTVar5;
}

Assistant:

TPZGeoEl *TPZGeoElRefLess<TGeo>::CreateBCGeoBlendEl(int side,int bc)
{
	int sidennodes = TGeo::NSideNodes(side);
	TPZManVector<int64_t> nodeindices(sidennodes);
	int inode;
	for(inode=0; inode<sidennodes; inode++){
		nodeindices[inode] = this->SideNodeIndex(side,inode);
	}
	int64_t index;
	
	TPZGeoMesh *mesh = this->Mesh();
	MElementType BCtype = TGeo::Type(side);
	
	TPZGeoEl *newel = mesh->CreateGeoBlendElement(BCtype, nodeindices, bc, index);
	TPZGeoElSide me(this,side);
	TPZGeoElSide newelside(newel,newel->NSides()-1);
	
	newelside.InsertConnectivity(me);
	newel->Initialize();
	
	return newel;
}